

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_and_uint64(uint64_t *res,uint64_t *first,uint64_t *second,uint64_t *r,view_t *view,
                   uint viewshift)

{
  uint uVar1;
  ulong uVar2;
  uint64_t tmp2;
  uint64_t tmp1;
  uint j;
  uint m;
  uint viewshift_local;
  view_t *view_local;
  uint64_t *r_local;
  uint64_t *second_local;
  uint64_t *first_local;
  uint64_t *res_local;
  
  for (m = 0; m < 3; m = m + 1) {
    uVar1 = (m + 1) % 3;
    uVar2 = (second[m] ^ second[uVar1]) & first[m] ^ first[uVar1] & second[m] ^ r[m] ^ r[uVar1];
    res[m] = uVar2;
    if (viewshift == 0) {
      view->t[m] = uVar2;
    }
    else {
      view->t[m] = view->t[m] ^ uVar2 >> ((byte)viewshift & 0x3f);
    }
  }
  return;
}

Assistant:

static void mpc_and_uint64(uint64_t* res, uint64_t const* first, uint64_t const* second,
                           uint64_t const* r, view_t* view, unsigned viewshift) {
  for (unsigned m = 0; m < SC_PROOF; ++m) {
    const unsigned j = (m + 1) % SC_PROOF;
    uint64_t tmp1    = second[m] ^ second[j];
    uint64_t tmp2    = first[j] & second[m];
    tmp1             = tmp1 & first[m];
    tmp1             = tmp1 ^ tmp2;
    tmp2             = r[m] ^ r[j];
    res[m] = tmp1 = tmp1 ^ tmp2;
    if (viewshift) {
      tmp1       = tmp1 >> viewshift;
      view->t[m] = view->t[m] ^ tmp1;
    } else {
      // on first call (viewshift == 0), view->t[0..2] == 0
      view->t[m] = tmp1;
    }
  }
}